

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Syndicated_C2_Request.cpp
# Opt level: O0

object get_uint8_c2_req(SRUP_MSG_SYNDICATED_C2_REQ *self)

{
  uint8_t *x;
  SRUP_MSG_SYNDICATED_C2_REQ *in_RSI;
  uint8_t *rv;
  SRUP_MSG_SYNDICATED_C2_REQ *self_local;
  
  x = SRUP_MSG_SYNDICATED_C2_REQ::data_uint8(in_RSI);
  if (x == (uint8_t *)0x0) {
    boost::python::api::object::object((object *)self);
  }
  else {
    boost::python::api::object::object<unsigned_char>((object *)self,x);
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_uint8_c2_req(SRUP_MSG_SYNDICATED_C2_REQ& self)
{
    uint8_t* rv;
    rv = self.data_uint8();

    if (rv != nullptr)
        return boost::python::object(*rv);
    else
        return boost::python::object();
}